

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

UniValue *
RPCConvertValues(UniValue *__return_storage_ptr__,string *strMethod,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *strParams)

{
  pointer pbVar1;
  UniValue val;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  string_view arg_value;
  string in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff68 [56];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VARR,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string((string *)&local_58);
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pbVar1 = (strParams->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(strParams->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar3)
    break;
    arg_value._M_str = pbVar1[uVar3]._M_dataplus._M_p;
    arg_value._M_len = pbVar1[uVar3]._M_string_length;
    CRPCConvertTable::ArgToUniValue
              ((UniValue *)&stack0xffffffffffffff50,&rpcCvtTable,arg_value,strMethod,uVar2);
    val._32_56_ = in_stack_ffffffffffffff68;
    val._0_32_ = in_stack_ffffffffffffff48;
    UniValue::push_back(__return_storage_ptr__,val);
    UniValue::~UniValue((UniValue *)&stack0xffffffffffffff50);
    uVar2 = uVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue RPCConvertValues(const std::string &strMethod, const std::vector<std::string> &strParams)
{
    UniValue params(UniValue::VARR);

    for (unsigned int idx = 0; idx < strParams.size(); idx++) {
        std::string_view value{strParams[idx]};
        params.push_back(rpcCvtTable.ArgToUniValue(value, strMethod, idx));
    }

    return params;
}